

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstruct<std::complex<float>_>::Contribute_v1
          (TPZDohrSubstruct<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *v1,
          TPZFMatrix<std::complex<float>_> *invKc_rc)

{
  ulong uVar1;
  int iVar2;
  int64_t iVar3;
  complex<float> *pcVar4;
  complex<float> *pcVar5;
  pair<int,_int> *ppVar6;
  TPZFMatrix<std::complex<float>_> *this_00;
  long in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  pair<int,_int> ind;
  int neqs;
  TPZFMatrix<std::complex<float>_> temp2;
  TPZFMatrix<std::complex<float>_> temp;
  int i;
  complex<float> *in_stack_fffffffffffffe28;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  complex<float> *in_stack_fffffffffffffe48;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffe50;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffe60;
  int64_t in_stack_fffffffffffffe90;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffea0;
  int local_158;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffeb8;
  TPZMatrix<std::complex<float>_> *in_stack_fffffffffffffec0;
  int local_1c;
  
  TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x490));
  TPZFMatrix<std::complex<float>_>::TPZFMatrix
            (in_stack_fffffffffffffea0,in_RDI,in_stack_fffffffffffffe90);
  TPZFMatrix<std::complex<float>_>::TPZFMatrix(in_stack_fffffffffffffe60);
  local_1c = 0;
  while( true ) {
    iVar3 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x490));
    if (iVar3 <= local_1c) break;
    TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x490),(long)local_1c);
    pcVar4 = TPZFMatrix<std::complex<float>_>::operator()
                       (in_stack_fffffffffffffe50,(int64_t)in_stack_fffffffffffffe48,
                        CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    pcVar5 = TPZFMatrix<std::complex<float>_>::operator()
                       (in_stack_fffffffffffffe50,(int64_t)in_stack_fffffffffffffe48,
                        CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    pcVar5->_M_value = pcVar4->_M_value;
    local_1c = local_1c + 1;
  }
  uVar1 = (ulong)_local_158 >> 0x20;
  TPZMatrix<std::complex<float>_>::Multiply
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
             (TPZFMatrix<std::complex<float>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),(int)uVar1);
  iVar3 = TPZVec<std::pair<int,_int>_>::NElements((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x5d8));
  iVar2 = (int)iVar3;
  for (local_1c = 0; local_1c < iVar2; local_1c = local_1c + 1) {
    ppVar6 = TPZVec<std::pair<int,_int>_>::operator[]
                       ((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x5d8),(long)local_1c);
    local_158 = (*ppVar6).first;
    this_00 = (TPZFMatrix<std::complex<float>_> *)
              TPZVec<std::complex<float>_>::operator[]
                        ((TPZVec<std::complex<float>_> *)(in_RDI + 0x4b0),(long)local_158);
    in_stack_fffffffffffffe48 =
         TPZFMatrix<std::complex<float>_>::operator()
                   (this_00,(int64_t)in_stack_fffffffffffffe48,
                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    std::operator*(in_stack_fffffffffffffe28,(complex<float> *)0x1ffbda5);
    uVar7 = extraout_XMM0_Da;
    uVar8 = extraout_XMM0_Db;
    in_stack_fffffffffffffe40 = extraout_XMM0_Dc;
    in_stack_fffffffffffffe44 = extraout_XMM0_Dd;
    TPZFMatrix<std::complex<float>_>::operator()
              (this_00,(int64_t)in_stack_fffffffffffffe48,
               CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc));
    std::complex<float>::operator+=
              ((complex<float> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (complex<float> *)CONCAT44(uVar8,uVar7));
  }
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix((TPZFMatrix<std::complex<float>_> *)0x1ffbe0d);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix((TPZFMatrix<std::complex<float>_> *)0x1ffbe1a);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::Contribute_v1(TPZFMatrix<TVar> &v1, TPZFMatrix<TVar> &invKc_rc) {
	int i;
	//  int j;
	TPZFMatrix<TVar> temp(fCoarseIndex.NElements(), 1);
	TPZFMatrix<TVar> temp2;
	//temp = R(ci)*K(c)_inverted*r(c)
	for (i=0;i<fCoarseIndex.NElements();i++) {
		temp(i, 0) = invKc_rc(fCoarseIndex[i],0);
	}
	//temp2 = Phi*temp
	fPhiC.Multiply(temp, temp2, 0);
	//v1 += R(i)_transposta*W(i)*temp2
#ifdef ZERO_INTERNAL_RESIDU
	for(i=0; i<fInternalEqs.NElements(); i++)
	{
		temp2(fInternalEqs[i],0) = 0.;
	}
#endif
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		v1(ind.second,0) += fWeights[ind.first]*temp2(ind.first,0);
	}
}